

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O2

void i2p_dest_tob32addr(i2p_dest *dest,char *buf,size_t sz)

{
  size_t sVar1;
  uint8_t digest [32];
  
  if (dest->sz < 0x201) {
    SHA256(dest->buf,dest->sz,digest);
    sVar1 = ByteStreamToBase32(digest,0x20,buf,sz);
    builtin_strncpy(buf + sVar1,".b32.i2p",9);
    (buf + sVar1 + 8)[1] = '\0';
    return;
  }
  __assert_fail("dest->sz <= sizeof(dest->buf)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/i2p_crypto.c"
                ,0x68,"void i2p_dest_tob32addr(struct i2p_dest *, char *, size_t)");
}

Assistant:

void i2p_dest_tob32addr(struct i2p_dest * dest, char * buf, size_t sz)
{
  assert(dest->sz <= sizeof(dest->buf));
  size_t len;
  uint8_t digest[32];
  SHA256(dest->buf, dest->sz, digest);
  len = ByteStreamToBase32(digest, 32, buf, sz);
  memcpy(buf + len, ".b32.i2p", 10);
}